

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTUtilities.h
# Opt level: O3

StaticAssertion * __thiscall
soul::ASTUtilities::createStaticAssertion
          (ASTUtilities *this,Context *context,Allocator *allocator,
          ArrayView<soul::pool_ref<soul::AST::Expression>_> args)

{
  StaticAssertion *pSVar1;
  string_view sVar2;
  size_t numArgs;
  anon_class_24_3_c18e7d5a getError;
  size_t local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  ArrayView<soul::pool_ref<soul::AST::Expression>_> local_80;
  anon_class_24_3_c18e7d5a local_70;
  CompileMessage local_58;
  
  local_80.e = args.s;
  local_70.numArgs = &local_a8;
  local_a8 = (long)local_80.e - (long)allocator >> 3;
  local_80.s = (pool_ref<soul::AST::Expression> *)allocator;
  if (local_a8 - 3 < 0xfffffffffffffffe) {
    CompileMessageHelpers::createMessage<>(&local_58,syntax,error,"Expected 1 or 2 arguments");
    AST::Context::throwError((Context *)this,&local_58,false);
  }
  local_70.args = &local_80;
  local_70.allocator = (Allocator *)context;
  if (allocator != (Allocator *)local_80.e) {
    local_70.numArgs = &local_a8;
    sVar2 = createStaticAssertion::anon_class_24_3_c18e7d5a::operator()(&local_70);
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,sVar2._M_str,sVar2._M_str + sVar2._M_len);
    pSVar1 = PoolAllocator::
             allocate<soul::AST::StaticAssertion,soul::AST::Context_const&,soul::pool_ref<soul::AST::Expression>&,std::__cxx11::string>
                       ((PoolAllocator *)context,(Context *)this,
                        (pool_ref<soul::AST::Expression> *)allocator,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    return pSVar1;
  }
  throwInternalCompilerError("! empty()","front",0xbf);
}

Assistant:

static AST::StaticAssertion& createStaticAssertion (const AST::Context& context, AST::Allocator& allocator,
                                                        ArrayView<pool_ref<AST::Expression>> args)
    {
        auto numArgs = args.size();

        if (numArgs != 1 && numArgs != 2)
            context.throwError (Errors::expected1or2Args());

        auto getError = [&] () -> std::string_view
        {
            if (numArgs == 2)
            {
                auto& e = args[1].get();

                if (AST::isResolvedAsConstant (e))
                    if (auto c = e.getAsConstant())
                        if (c->value.getType().isStringLiteral())
                            return allocator.stringDictionary.getStringForHandle (c->value.getStringLiteral());

                e.context.throwError (Errors::expectedStringLiteralAsArg2());
            }

            return {};
        };

        return allocator.allocate<AST::StaticAssertion> (context, args.front(), std::string (getError()));
    }